

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_tri_centroid(REF_GRID ref_grid,REF_INT *nodes,REF_DBL *uv)

{
  REF_GEOM ref_geom_00;
  REF_CELL pRVar1;
  uint uVar2;
  REF_INT local_5c;
  REF_STATUS ref_private_macro_code_rsb;
  REF_INT sens;
  REF_DBL node_uv [2];
  int local_3c;
  REF_INT cell_node;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_DBL *uv_local;
  REF_INT *nodes_local;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  pRVar1 = ref_grid->cell[3];
  *uv = 0.0;
  uv[1] = 0.0;
  local_3c = 0;
  while( true ) {
    if (pRVar1->node_per <= local_3c) {
      return 0;
    }
    uVar2 = ref_geom_cell_tuv(ref_geom_00,nodes[local_3c],nodes,2,
                              (REF_DBL *)&ref_private_macro_code_rsb,&local_5c);
    if (uVar2 != 0) break;
    *uv = _ref_private_macro_code_rsb * 0.3333333333333333 + *uv;
    uv[1] = node_uv[0] * 0.3333333333333333 + uv[1];
    local_3c = local_3c + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x6c5,
         "ref_geom_tri_centroid",(ulong)uVar2,"cell node uv");
  ref_geom_tec(ref_grid,"ref_geom_tri_centroid_error.tec");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_centroid(REF_GRID ref_grid, REF_INT *nodes,
                                         REF_DBL *uv) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell_node;
  REF_DBL node_uv[2];
  REF_INT sens;
  uv[0] = 0.0;
  uv[1] = 0.0;
  each_ref_cell_cell_node(ref_cell, cell_node) {
    RSB(ref_geom_cell_tuv(ref_geom, nodes[cell_node], nodes, REF_GEOM_FACE,
                          node_uv, &sens),
        "cell node uv",
        { ref_geom_tec(ref_grid, "ref_geom_tri_centroid_error.tec"); });
    uv[0] += (1.0 / 3.0) * node_uv[0];
    uv[1] += (1.0 / 3.0) * node_uv[1];
  }

  return REF_SUCCESS;
}